

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapping0.c
# Opt level: O0

int ilog(uint v)

{
  undefined4 local_10;
  undefined4 local_c;
  int ret;
  uint v_local;
  
  local_10 = 0;
  local_c = v;
  if (v != 0) {
    local_c = v - 1;
  }
  for (; local_c != 0; local_c = local_c >> 1) {
    local_10 = local_10 + 1;
  }
  return local_10;
}

Assistant:

static int ilog(unsigned int v){
  int ret=0;
  if(v)--v;
  while(v){
    ret++;
    v>>=1;
  }
  return(ret);
}